

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Global::Mark(Global *this,Store *store)

{
  uint uVar1;
  
  uVar1 = *(int *)&(this->type_).super_ExternType.field_0xc + 0x18;
  if ((uVar1 < 0x1b) && ((0x40001c1U >> (uVar1 & 0x1f) & 1) != 0)) {
    Store::Mark(store,(Ref)(this->value_).ref_.index);
    return;
  }
  return;
}

Assistant:

void Global::Mark(Store& store) {
  if (IsReference(type_.type)) {
    store.Mark(value_.ref_);
  }
}